

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# apted_tree_index_impl.h
# Opt level: O1

void __thiscall
ted::APTEDTreeIndex<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAPTED>::ted_init
          (APTEDTreeIndex<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAPTED>
           *this,TreeIndexAPTED *t1,TreeIndexAPTED *t2)

{
  int iVar1;
  int iVar2;
  size_t sVar3;
  double *pdVar4;
  PreLToSubtreeCost *pPVar5;
  size_t row;
  size_t col;
  double dVar6;
  
  (this->super_TEDAlgorithm<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAPTED>).
  subproblem_counter_ = 0;
  iVar1 = (t1->super_Constants).tree_size_;
  iVar2 = (t2->super_Constants).tree_size_;
  if (iVar2 < iVar1) {
    iVar2 = iVar1;
  }
  std::vector<double,_std::allocator<double>_>::resize(&this->q_,(long)(iVar2 + 1));
  std::vector<int,_std::allocator<int>_>::resize(&this->fn_,(long)(iVar2 + 2));
  std::vector<int,_std::allocator<int>_>::resize(&this->ft_,(long)(iVar2 + 2));
  if (0 < (t1->super_Constants).tree_size_) {
    row = 0;
    do {
      if (0 < (t2->super_Constants).tree_size_) {
        iVar1 = (t1->super_PreLToSize).prel_to_size_.super__Vector_base<int,_std::allocator<int>_>.
                _M_impl.super__Vector_impl_data._M_start[row];
        col = 0;
        do {
          iVar2 = (t2->super_PreLToSize).prel_to_size_.super__Vector_base<int,_std::allocator<int>_>
                  ._M_impl.super__Vector_impl_data._M_start[col];
          if ((iVar1 == 1) && (dVar6 = 0.0, iVar2 == 1)) {
LAB_00119dba:
            pdVar4 = data_structures::Matrix<double>::at(&this->delta_,row,col);
            *pdVar4 = dVar6;
          }
          else if ((iVar1 == 1) || (iVar2 == 1)) {
            pPVar5 = &t1->super_PreLToSubtreeCost;
            sVar3 = row;
            if (iVar1 == 1) {
              pPVar5 = (PreLToSubtreeCost *)&(t2->super_PreLToSubtreeCost).prel_to_subtree_ins_cost_
              ;
              sVar3 = col;
            }
            dVar6 = (pPVar5->prel_to_subtree_del_cost_).
                    super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start[sVar3] + -1.0;
            goto LAB_00119dba;
          }
          col = col + 1;
        } while ((long)col < (long)(t2->super_Constants).tree_size_);
      }
      row = row + 1;
    } while ((long)row < (long)(t1->super_Constants).tree_size_);
  }
  return;
}

Assistant:

void APTEDTreeIndex<CostModel, TreeIndex>::ted_init(const TreeIndex& t1, const TreeIndex& t2) {
  // Reset the subproblems counter.
  subproblem_counter_ = 0;
  // Initialize arrays.
  int max_size = std::max(t1.tree_size_, t2.tree_size_) + 1;
  // TODO: Move q initialisation to spfA.
  q_.resize(max_size);
  // TODO: Do not use fn and ft arrays [1, Section 8.4].
  fn_.resize(max_size + 1);
  ft_.resize(max_size + 1);
  // Compute subtree distances without the root nodes when one of subtrees
  // is a single node.
  int size_x = -1;
  int size_y = -1;
  // int parent_x = -1;
  // int parent_y = -1;
  // Loop over the nodes in reversed left-to-right preorder.
  for(int x = 0; x < t1.tree_size_; ++x) {
    size_x = t1.prel_to_size_[x];
    // parent_x = ni_1.preL_to_parent_[x];
    for(int y = 0; y < t2.tree_size_; ++y) {
      size_y = t2.prel_to_size_[y];
      // parent_y = ni_2.preL_to_parent_[y];
      // Set values in delta based on the sums of deletion and insertion
      // costs. Substract the costs for root nodes.
      // In this method we don't have to verify the order of the input trees
      // because it is equal to the original.
      if (size_x == 1 && size_y == 1) {
        delta_.at(x, y) = 0.0;
      } else if (size_x == 1) {
        delta_.at(x, y) = t2.prel_to_subtree_ins_cost_[y] - c_.ins(t2.prel_to_label_id_[y]);
      } else if (size_y == 1) {
        delta_.at(x, y) = t1.prel_to_subtree_del_cost_[x] - c_.del(t1.prel_to_label_id_[x]);
      }
    }
  }
}